

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

double __thiscall mp::internal::TextReader<fmt::Locale>::ReadDouble(TextReader<fmt::Locale> *this)

{
  char *pcVar1;
  char **__endptr;
  double dVar2;
  
  SkipSpace(this);
  pcVar1 = (this->super_ReaderBase).ptr_;
  dVar2 = 0.0;
  if ((*pcVar1 != '\n') &&
     (dVar2 = fmt::Locale::strtod(&(this->locale_).super_Locale,(char *)this,__endptr),
     (this->super_ReaderBase).ptr_ != pcVar1)) {
    return dVar2;
  }
  ReportError<>(this,(CStringRef)0x20ed74);
  return dVar2;
}

Assistant:

double ReadDouble() {
    SkipSpace();
    const char *start = ptr_;
    double value = 0;
    if (*ptr_ != '\n')
      value = locale_.strtod(ptr_);
    if (ptr_ == start)
      ReportError("expected double");
    return value;
  }